

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall deqp::egl::anon_unknown_1::InfiniteLoop::~InfiniteLoop(InfiniteLoop *this)

{
  ~InfiniteLoop(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

InfiniteLoop::~InfiniteLoop (void)
{
	try
	{
		// Reset GL_CONTEXT_LOST error before destroying resources
		m_gl.getGraphicsResetStatus();
		teardown();
	}
	catch (...)
	{
		// Ignore GL errors from teardown()
	}
}